

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_string_normalize_D(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  uchar uVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  archive_string *paVar5;
  size_t sVar6;
  wchar_t wVar7;
  wchar_t local_158;
  wchar_t local_150;
  wchar_t local_11c;
  wchar_t local_118;
  wchar_t k_1;
  wchar_t j;
  wchar_t k;
  wchar_t T;
  wchar_t V;
  wchar_t L;
  wchar_t ccc;
  wchar_t fdj;
  wchar_t fdi;
  anon_struct_8_2_74731b7c fdc [10];
  uint local_98;
  wchar_t SIndex;
  uint32_t cp2;
  uint32_t cp1;
  char *ucptr;
  _func_size_t_char_ptr_size_t_uint32_t *unparse;
  _func_wchar_t_uint32_t_ptr_char_ptr_size_t *parse;
  int local_70;
  wchar_t tm;
  wchar_t ts;
  wchar_t spair;
  wchar_t ret;
  wchar_t n2;
  wchar_t n;
  wchar_t always_replace;
  size_t w;
  uint32_t uc2;
  uint32_t uc;
  char *endp;
  char *p;
  char *s;
  archive_string_conv *sc_local;
  size_t len_local;
  void *_p_local;
  archive_string *as_local;
  
  ts = L'\0';
  local_70 = 1;
  if ((sc->flag & 0x400U) == 0) {
    if ((sc->flag & 0x1000U) == 0) {
      if ((sc->flag & 0x100U) == 0) {
        n2 = L'\0';
        if ((sc->flag & 0x800U) == 0) {
          if ((sc->flag & 0x2000U) == 0) {
            ucptr = (char *)unicode_to_utf8;
          }
          else {
            ucptr = (char *)unicode_to_utf16le;
            local_70 = 2;
          }
        }
        else {
          ucptr = (char *)unicode_to_utf16be;
          local_70 = 2;
        }
      }
      else {
        ucptr = (char *)unicode_to_utf8;
        n2 = (wchar_t)((sc->flag & 0x200U) == 0);
      }
    }
    else {
      ucptr = (char *)unicode_to_utf16le;
      local_70 = 2;
      n2 = (wchar_t)((sc->flag & 0x2000U) == 0);
    }
  }
  else {
    ucptr = (char *)unicode_to_utf16be;
    local_70 = 2;
    n2 = (wchar_t)((sc->flag & 0x800U) == 0);
  }
  if ((sc->flag & 0x800U) == 0) {
    if ((sc->flag & 0x2000U) == 0) {
      unparse = cesu8_to_unicode;
      parse._4_4_ = local_70;
      tm = L'\x06';
    }
    else {
      unparse = utf16le_to_unicode;
      parse._4_4_ = 1;
      tm = L'\x04';
    }
  }
  else {
    unparse = utf16be_to_unicode;
    parse._4_4_ = 1;
    tm = L'\x04';
  }
  p = (char *)_p;
  s = (char *)sc;
  sc_local = (archive_string_conv *)len;
  len_local = (size_t)_p;
  _p_local = as;
  paVar5 = archive_string_ensure(as,as->length + len * (long)parse._4_4_ + (long)local_70);
  if (paVar5 == (archive_string *)0x0) {
    as_local._4_4_ = L'\xffffffff';
  }
  else {
    endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
    _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
LAB_001c1ccf:
    sVar6 = (*unparse)((char *)((long)&w + 4),(size_t)p,(uint32_t)sc_local);
    ret = (wchar_t)sVar6;
    if (ret != L'\0') {
      while( true ) {
        if (ret < L'\0') goto LAB_001c1cfd;
        if ((ret == tm) || (n2 != L'\0')) {
          _cp2 = (char *)0x0;
        }
        else {
          _cp2 = p;
        }
        p = p + ret;
        sc_local = (archive_string_conv *)((long)sc_local - (long)ret);
        iVar4 = w._4_4_ + L'\xffff5400';
        if ((-1 < iVar4) && (iVar4 < 0x2ba4)) break;
        if (((uint)w._4_4_ >> 8 < 0x1d3) && (""[(uint)w._4_4_ >> 8] != '\0')) {
          if ((uint)w._4_4_ < 0x1d245) {
            uVar1 = ccc_val[ccc_val_index[""[(uint)w._4_4_ >> 8]][(uint)w._4_4_ >> 4 & 0xf]]
                    [(uint)(w._4_4_ & 0xf)];
          }
          else {
            uVar1 = '\0';
          }
          if (uVar1 != '\0') {
            if (_cp2 == (char *)0x0) {
              while (_n = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), _n == 0) {
                *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
                paVar5 = archive_string_ensure
                                   ((archive_string *)_p_local,
                                    *(long *)((long)_p_local + 0x10) +
                                    (long)sc_local * (long)parse._4_4_ + (long)local_70);
                if (paVar5 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
                _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
              }
              endp = endp + _n;
            }
            else {
              if (_uc2 < endp + ret) {
                *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
                paVar5 = archive_string_ensure
                                   ((archive_string *)_p_local,
                                    *(long *)((long)_p_local + 0x10) +
                                    (long)sc_local * (long)parse._4_4_ + (long)local_70);
                if (paVar5 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
                _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
              }
              switch(ret) {
              case L'\x04':
                *endp = *_cp2;
                _cp2 = _cp2 + 1;
                endp = endp + 1;
              case L'\x03':
                *endp = *_cp2;
                _cp2 = _cp2 + 1;
                endp = endp + 1;
              case L'\x02':
                *endp = *_cp2;
                _cp2 = _cp2 + 1;
                endp = endp + 1;
              case L'\x01':
                *endp = *_cp2;
                endp = endp + 1;
              default:
                _cp2 = (char *)0x0;
              }
            }
            goto LAB_001c1ccf;
          }
        }
        for (ccc = L'\0'; wVar7 = get_nfd((uint32_t *)&SIndex,&local_98,w._4_4_),
            wVar7 != L'\0' && ccc < L'\n'; ccc = ccc + L'\x01') {
          for (k_1 = ccc; L'\0' < k_1; k_1 = k_1 + L'\xffffffff') {
            *(undefined8 *)(&fdj + (long)k_1 * 2) =
                 *(undefined8 *)(&fdj + (long)(k_1 + L'\xffffffff') * 2);
          }
          if (local_98 < 0x1d245) {
            local_150 = (wchar_t)ccc_val[ccc_val_index[""[local_98 >> 8]][local_98 >> 4 & 0xf]]
                                 [local_98 & 0xf];
          }
          else {
            local_150 = L'\0';
          }
          fdi = local_150;
          w._4_4_ = SIndex;
          _cp2 = (char *)0x0;
        }
        while( true ) {
          sVar6 = (*unparse)((char *)&w,(size_t)p,(uint32_t)sc_local);
          spair = (wchar_t)sVar6;
          bVar2 = false;
          if (L'\0' < spair) {
            if ((uint)(wchar_t)w < 0x1d245) {
              local_158 = (wchar_t)ccc_val[ccc_val_index[""[(uint)(wchar_t)w >> 8]]
                                           [(uint)(wchar_t)w >> 4 & 0xf]][(uint)((wchar_t)w & 0xf)];
            }
            else {
              local_158 = L'\0';
            }
            V = local_158;
            bVar2 = false;
            if (local_158 != L'\0') {
              bVar2 = ccc < L'\n';
            }
          }
          if (!bVar2) break;
          p = p + spair;
          sc_local = (archive_string_conv *)((long)sc_local - (long)spair);
          local_118 = L'\0';
          while ((local_118 < ccc && (fdc[(long)local_118 + -1].ccc <= V))) {
            local_118 = local_118 + L'\x01';
          }
          if (local_118 < ccc) {
            for (local_11c = ccc; local_118 < local_11c; local_11c = local_11c + L'\xffffffff') {
              *(undefined8 *)(&fdj + (long)local_11c * 2) =
                   *(undefined8 *)(&fdj + (long)(local_11c + L'\xffffffff') * 2);
            }
            fdc[(long)local_118 + -1].ccc = V;
            (&fdj)[(long)local_118 * 2] = (wchar_t)w;
          }
          else {
            fdc[(long)ccc + -1].ccc = V;
            (&fdj)[(long)ccc * 2] = (wchar_t)w;
          }
          ccc = ccc + L'\x01';
        }
        if (_cp2 == (char *)0x0) {
          while( true ) {
            _n = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_);
            if (_n != 0) break;
            *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
            paVar5 = archive_string_ensure
                               ((archive_string *)_p_local,
                                *(long *)((long)_p_local + 0x10) +
                                (long)sc_local * (long)parse._4_4_ + (long)local_70);
            if (paVar5 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
            _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
          }
          endp = endp + _n;
        }
        else {
          if (_uc2 < endp + ret) {
            *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
            paVar5 = archive_string_ensure
                               ((archive_string *)_p_local,
                                *(long *)((long)_p_local + 0x10) +
                                (long)sc_local * (long)parse._4_4_ + (long)local_70);
            if (paVar5 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
            _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
          }
          switch(ret) {
          case L'\x04':
            *endp = *_cp2;
            _cp2 = _cp2 + 1;
            endp = endp + 1;
          case L'\x03':
            *endp = *_cp2;
            _cp2 = _cp2 + 1;
            endp = endp + 1;
          case L'\x02':
            *endp = *_cp2;
            _cp2 = _cp2 + 1;
            endp = endp + 1;
          case L'\x01':
            pcVar3 = endp;
            endp = endp + 1;
            *pcVar3 = *_cp2;
          default:
            _cp2 = (char *)0x0;
          }
        }
        for (L = L'\0'; L < ccc; L = L + L'\x01') {
          w._4_4_ = (&fdj)[(long)L * 2];
          _cp2 = (char *)0x0;
          while( true ) {
            _n = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_);
            if (_n != 0) break;
            *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
            paVar5 = archive_string_ensure
                               ((archive_string *)_p_local,
                                *(long *)((long)_p_local + 0x10) +
                                (long)sc_local * (long)parse._4_4_ + (long)local_70);
            if (paVar5 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
            _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
          }
          endp = endp + _n;
        }
        if (spair == L'\0') goto LAB_001c30c3;
        w._4_4_ = (wchar_t)w;
        _cp2 = (char *)0x0;
        ret = spair;
      }
      w._4_4_ = iVar4 / 0x24c + 0x1100;
      wVar7 = iVar4 % 0x1c + L'ᆧ';
      _cp2 = (char *)0x0;
      while (_n = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), _n == 0) {
        *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
        paVar5 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                            (long)local_70);
        if (paVar5 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
        _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
      }
      endp = endp + _n;
      _cp2 = (char *)0x0;
      w._4_4_ = (int)((long)((ulong)(uint)((int)((long)iVar4 % 0x24c) >> 0x1f) << 0x20 |
                            (long)iVar4 % 0x24c & 0xffffffffU) / 0x1c) + L'ᅡ';
      while (_n = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), _n == 0) {
        *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
        paVar5 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                            (long)local_70);
        if (paVar5 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
        _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
      }
      endp = endp + _n;
      if (wVar7 != L'ᆧ') {
        _cp2 = (char *)0x0;
        w._4_4_ = wVar7;
        while (_n = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), _n == 0) {
          *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
          paVar5 = archive_string_ensure
                             ((archive_string *)_p_local,
                              *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_
                              + (long)local_70);
          if (paVar5 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
          _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
        }
        endp = endp + _n;
      }
      goto LAB_001c1ccf;
    }
LAB_001c30c3:
    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
    *(undefined1 *)(*_p_local + *(long *)((long)_p_local + 8)) = 0;
    if (local_70 == 2) {
      *(undefined1 *)(*_p_local + 1 + *(long *)((long)_p_local + 8)) = 0;
    }
    as_local._4_4_ = ts;
  }
  return as_local._4_4_;
LAB_001c1cfd:
  while (_n = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), _n == 0) {
    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
    paVar5 = archive_string_ensure
                       ((archive_string *)_p_local,
                        *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                        (long)local_70);
    if (paVar5 == (archive_string *)0x0) {
      return L'\xffffffff';
    }
    endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
    _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
  }
  endp = endp + _n;
  p = p + -ret;
  sc_local = (archive_string_conv *)((long)sc_local - (long)-ret);
  ts = L'\xffffffff';
  goto LAB_001c1ccf;
}

Assistant:

static int
archive_string_normalize_D(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr;
		uint32_t cp1, cp2;
		int SIndex;
		struct {
			uint32_t uc;
			int ccc;
		} fdc[FDC_MAX];
		int fdi, fdj;
		int ccc;

check_first_code:
		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Hangul Decomposition. */
		if ((SIndex = uc - HC_SBASE) >= 0 && SIndex < HC_SCOUNT) {
			int L = HC_LBASE + SIndex / HC_NCOUNT;
			int V = HC_VBASE + (SIndex % HC_NCOUNT) / HC_TCOUNT;
			int T = HC_TBASE + SIndex % HC_TCOUNT;

			REPLACE_UC_WITH(L);
			WRITE_UC();
			REPLACE_UC_WITH(V);
			WRITE_UC();
			if (T != HC_TBASE) {
				REPLACE_UC_WITH(T);
				WRITE_UC();
			}
			continue;
		}
		if (IS_DECOMPOSABLE_BLOCK(uc) && CCC(uc) != 0) {
			WRITE_UC();
			continue;
		}

		fdi = 0;
		while (get_nfd(&cp1, &cp2, uc) && fdi < FDC_MAX) {
			int k;

			for (k = fdi; k > 0; k--)
				fdc[k] = fdc[k-1];
			fdc[0].ccc = CCC(cp2);
			fdc[0].uc = cp2;
			fdi++;
			REPLACE_UC_WITH(cp1);
		}

		/* Read following code points. */
		while ((n2 = parse(&uc2, s, len)) > 0 &&
		    (ccc = CCC(uc2)) != 0 && fdi < FDC_MAX) {
			int j, k;

			s += n2;
			len -= n2;
			for (j = 0; j < fdi; j++) {
				if (fdc[j].ccc > ccc)
					break;
			}
			if (j < fdi) {
				for (k = fdi; k > j; k--)
					fdc[k] = fdc[k-1];
				fdc[j].ccc = ccc;
				fdc[j].uc = uc2;
			} else {
				fdc[fdi].ccc = ccc;
				fdc[fdi].uc = uc2;
			}
			fdi++;
		}

		WRITE_UC();
		for (fdj = 0; fdj < fdi; fdj++) {
			REPLACE_UC_WITH(fdc[fdj].uc);
			WRITE_UC();
		}

		if (n2 == 0)
			break;
		REPLACE_UC_WITH(uc2);
		n = n2;
		goto check_first_code;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}